

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::prepareWorkload
          (OperatorPerformanceCase *this,int progNdx,int workload)

{
  deUint32 dVar1;
  int numDrawCalls;
  reference this_00;
  ShaderProgram *this_01;
  int workload_local;
  int progNdx_local;
  OperatorPerformanceCase *this_local;
  
  this_00 = std::
            vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
            ::operator[](&this->m_programs,(long)progNdx);
  this_01 = de::SharedPtr<glu::ShaderProgram>::operator->(this_00);
  dVar1 = glu::ShaderProgram::getProgram(this_01);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
            (this,(ulong)dVar1,(ulong)(uint)workload);
  numDrawCalls = deqp::gls::TheilSenCalibrator::getCallCount(&this->m_calibrator);
  render(this,numDrawCalls);
  return;
}

Assistant:

void OperatorPerformanceCase::prepareWorkload (int progNdx, int workload)
{
	setWorkloadSizeUniform(m_programs[progNdx]->getProgram(), workload);
	render(m_calibrator.getCallCount());
}